

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

int __kmp_api_omp_test_lock_(void **user_lock)

{
  int iVar1;
  void **in_stack_00000008;
  kmp_int32 in_stack_00000014;
  ident_t *in_stack_00000018;
  
  __kmp_get_global_thread_id_reg();
  iVar1 = __kmpc_test_lock(in_stack_00000018,in_stack_00000014,in_stack_00000008);
  return iVar1;
}

Assistant:

int FTN_STDCALL
xexpand(FTN_TEST_LOCK)( void **user_lock )
{
    #ifdef KMP_STUB
        if ( *((kmp_stub_lock_t *)user_lock) == UNINIT ) {
            // TODO: Issue an error.
        }; // if
        if ( *((kmp_stub_lock_t *)user_lock) == LOCKED ) {
            return 0;
        }; // if
        *((kmp_stub_lock_t *)user_lock) = LOCKED;
        return 1;
    #else
        return __kmpc_test_lock( NULL, __kmp_entry_gtid(), user_lock );
    #endif
}